

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::Check
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,bool expectFull,bool expectPending
          )

{
  code *pcVar1;
  bool bVar2;
  undefined8 *in_FS_OFFSET;
  byte local_25;
  bool expectPending_local;
  bool expectFull_local;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  bVar2 = IsFreeBitsValid(this);
  if (bVar2) {
    CheckFreeBitVector(this,false);
  }
  else {
    CheckDebugFreeBitVector(this,false);
  }
  bVar2 = HasAnyDisposeObjects(this);
  if (expectPending != bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x6bf,"(expectPending == HasAnyDisposeObjects())",
                       "expectPending == HasAnyDisposeObjects()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if (((this->isInAllocator & 1U) == 0) && ((this->isClearedFromAllocator & 1U) == 0)) {
    bVar2 = HasFreeObject(this);
    local_25 = 0;
    if (!bVar2) {
      bVar2 = HasAnyDisposeObjects(this);
      local_25 = bVar2 ^ 0xff;
    }
    if (expectFull != (bool)(local_25 & 1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x6cc,
                         "(expectFull == (!this->HasFreeObject() && !HasAnyDisposeObjects()))",
                         "expectFull == (!this->HasFreeObject() && !HasAnyDisposeObjects())");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  else if ((!expectFull) || (expectPending)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x6c8,"(expectFull && !expectPending)","expectFull && !expectPending");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::Check(bool expectFull, bool expectPending)
{
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    // If we allocated from this block during the concurrent sweep the free bit vectors would be invalid.
#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
    if (!this->wasAllocatedFromDuringSweep)
#endif
#endif
    {
        if (this->IsFreeBitsValid())
        {
            CheckFreeBitVector(false);
        }
        else
        {
            CheckDebugFreeBitVector(false);
        }
    }

    Assert(expectPending == HasAnyDisposeObjects());

    // As the blocks are added to the SLIST and used from there during concurrent sweep, the expectFull assertion doesn't hold anymore.
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    if (!CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
#endif
    {
        if (this->isInAllocator || this->isClearedFromAllocator)
        {
            Assert(expectFull && !expectPending);
        }
        else
        {
            Assert(expectFull == (!this->HasFreeObject() && !HasAnyDisposeObjects()));
        }
    }
}